

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_DCT.cc
# Opt level: O0

void __thiscall Pl_DCT::decompress(Pl_DCT *this,void *cinfo_p,Buffer *b)

{
  int iVar1;
  uint uVar2;
  runtime_error *this_00;
  undefined8 *puVar3;
  Pipeline *pPVar4;
  JSAMPARRAY buffer;
  jpeg_progress_mgr progress_mgr;
  uint width;
  jpeg_decompress_struct *cinfo;
  Buffer *b_local;
  void *cinfo_p_local;
  Pl_DCT *this_local;
  
  jpeg_CreateDecompress(cinfo_p,0x50,0x290);
  if (0 < (long)(anonymous_namespace)::memory_limit) {
    *(ulong *)(*(long *)((long)cinfo_p + 8) + 0x58) = (anonymous_namespace)::memory_limit;
  }
  jpeg_buffer_src((j_decompress_ptr)cinfo_p,b);
  jpeg_read_header(cinfo_p,1);
  jpeg_calc_output_dimensions(cinfo_p);
  iVar1 = *(int *)((long)cinfo_p + 0x88);
  uVar2 = QIntC::to_uint<int>((int *)((long)cinfo_p + 0x94));
  uVar2 = iVar1 * uVar2;
  if (0 < (long)(anonymous_namespace)::memory_limit) {
    if ((anonymous_namespace)::memory_limit / (uint)(*(int *)((long)cinfo_p + 0x8c) * 0x14) <
        (ulong)uVar2) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,"Pl_DCT::decompress: JPEG data large - may be too slow");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  if (0 < (anonymous_namespace)::scan_limit) {
    buffer = (JSAMPARRAY)progress_monitor;
    *(JSAMPARRAY **)((long)cinfo_p + 0x10) = &buffer;
  }
  puVar3 = (undefined8 *)(**(code **)(*(long *)((long)cinfo_p + 8) + 0x10))(cinfo_p,1,uVar2);
  jpeg_start_decompress(cinfo_p);
  while (*(uint *)((long)cinfo_p + 0xa8) < *(uint *)((long)cinfo_p + 0x8c)) {
    jpeg_read_scanlines(cinfo_p,puVar3,1);
    pPVar4 = Pipeline::next(&this->super_Pipeline);
    (*pPVar4->_vptr_Pipeline[2])(pPVar4,*puVar3,(ulong)uVar2);
  }
  jpeg_finish_decompress(cinfo_p);
  pPVar4 = Pipeline::next(&this->super_Pipeline);
  (*pPVar4->_vptr_Pipeline[3])();
  return;
}

Assistant:

void
Pl_DCT::decompress(void* cinfo_p, Buffer* b)
{
    auto* cinfo = reinterpret_cast<jpeg_decompress_struct*>(cinfo_p);

#if ((defined(__GNUC__) && ((__GNUC__ * 100) + __GNUC_MINOR__) >= 406) || defined(__clang__))
# pragma GCC diagnostic push
# pragma GCC diagnostic ignored "-Wold-style-cast"
#endif
    jpeg_create_decompress(cinfo);
#if ((defined(__GNUC__) && ((__GNUC__ * 100) + __GNUC_MINOR__) >= 406) || defined(__clang__))
# pragma GCC diagnostic pop
#endif

    if (memory_limit > 0) {
        cinfo->mem->max_memory_to_use = memory_limit;
    }

    jpeg_buffer_src(cinfo, b);

    (void)jpeg_read_header(cinfo, TRUE);
    (void)jpeg_calc_output_dimensions(cinfo);
    unsigned int width = cinfo->output_width * QIntC::to_uint(cinfo->output_components);
    if (memory_limit > 0 &&
        width > (static_cast<unsigned long>(memory_limit) / (20U * cinfo->output_height))) {
        // Even if jpeglib does not run out of memory, qpdf will while buffering the data before
        // writing it. Furthermore, for very large images runtime can be significant before the
        // first warning is encountered causing a timeout in oss-fuzz.
        throw std::runtime_error("Pl_DCT::decompress: JPEG data large - may be too slow");
    }
    jpeg_progress_mgr progress_mgr;
    if (scan_limit > 0) {
        progress_mgr.progress_monitor = &progress_monitor;
        cinfo->progress = &progress_mgr;
    }
    JSAMPARRAY buffer =
        (*cinfo->mem->alloc_sarray)(reinterpret_cast<j_common_ptr>(cinfo), JPOOL_IMAGE, width, 1);

    (void)jpeg_start_decompress(cinfo);
    while (cinfo->output_scanline < cinfo->output_height) {
        (void)jpeg_read_scanlines(cinfo, buffer, 1);
        next()->write(buffer[0], width * sizeof(buffer[0][0]));
    }
    (void)jpeg_finish_decompress(cinfo);
    next()->finish();
}